

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O3

idx_t duckdb::TernaryExecutor::
      SelectLoopSelSwitch<float,float,float,duckdb::LowerInclusiveBetweenOperator,false>
                (UnifiedVectorFormat *adata,UnifiedVectorFormat *bdata,UnifiedVectorFormat *cdata,
                SelectionVector *sel,idx_t count,SelectionVector *true_sel,
                SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  bool bVar2;
  idx_t iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  SelectionVector *bsel;
  SelectionVector *csel;
  long lVar9;
  ValidityMask *cvalidity;
  ValidityMask *bvalidity;
  ValidityMask *avalidity;
  float local_94;
  float local_90;
  float local_8c;
  SelectionVector *local_88;
  float *local_80;
  float *local_78;
  float *local_70;
  SelectionVector *local_68;
  SelectionVector *local_60;
  SelectionVector *local_58;
  ulong local_50;
  SelectionVector *local_48;
  ValidityMask *local_40;
  ValidityMask *local_38;
  
  local_88 = adata->sel;
  local_70 = (float *)adata->data;
  bsel = bdata->sel;
  local_78 = (float *)bdata->data;
  csel = cdata->sel;
  local_80 = (float *)cdata->data;
  avalidity = &adata->validity;
  bvalidity = &bdata->validity;
  cvalidity = &cdata->validity;
  if (false_sel == (SelectionVector *)0x0 || true_sel == (SelectionVector *)0x0) {
    local_68 = sel;
    local_60 = csel;
    local_58 = bsel;
    local_50 = count;
    if (true_sel == (SelectionVector *)0x0) {
      if (count == 0) {
        lVar9 = 0;
      }
      else {
        lVar9 = 0;
        uVar6 = 0;
        do {
          uVar7 = uVar6;
          if (sel->sel_vector != (sel_t *)0x0) {
            uVar7 = (ulong)sel->sel_vector[uVar6];
          }
          uVar5 = uVar6;
          if (local_88->sel_vector != (sel_t *)0x0) {
            uVar5 = (ulong)local_88->sel_vector[uVar6];
          }
          uVar8 = uVar6;
          if (bsel->sel_vector != (sel_t *)0x0) {
            uVar8 = (ulong)bsel->sel_vector[uVar6];
          }
          uVar4 = uVar6;
          if (csel->sel_vector != (sel_t *)0x0) {
            uVar4 = (ulong)csel->sel_vector[uVar6];
          }
          puVar1 = (avalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
          if ((((puVar1 == (unsigned_long *)0x0) ||
               ((puVar1[uVar5 >> 6] >> (uVar5 & 0x3f) & 1) != 0)) &&
              ((puVar1 = (bvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask,
               puVar1 == (unsigned_long *)0x0 || ((puVar1[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) != 0)))
              ) && ((puVar1 = (cvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask,
                    puVar1 == (unsigned_long *)0x0 ||
                    ((puVar1[uVar4 >> 6] >> (uVar4 & 0x3f) & 1) != 0)))) {
            local_94 = local_70[uVar5];
            local_8c = local_78[uVar8];
            local_90 = local_80[uVar4];
            bVar2 = GreaterThanEquals::Operation<float>(&local_94,&local_8c);
            uVar5 = 1;
            sel = local_68;
            count = local_50;
            bsel = local_58;
            csel = local_60;
            if (bVar2) {
              bVar2 = GreaterThan::Operation<float>(&local_90,&local_94);
              uVar5 = (ulong)!bVar2;
              sel = local_68;
              count = local_50;
              bsel = local_58;
              csel = local_60;
            }
          }
          else {
            uVar5 = 1;
          }
          false_sel->sel_vector[lVar9] = (sel_t)uVar7;
          lVar9 = lVar9 + uVar5;
          uVar6 = uVar6 + 1;
        } while (count != uVar6);
      }
      iVar3 = count - lVar9;
    }
    else if (count == 0) {
      iVar3 = 0;
    }
    else {
      iVar3 = 0;
      uVar6 = 0;
      local_48 = true_sel;
      local_40 = cvalidity;
      local_38 = bvalidity;
      do {
        uVar7 = uVar6;
        if (sel->sel_vector != (sel_t *)0x0) {
          uVar7 = (ulong)sel->sel_vector[uVar6];
        }
        uVar5 = uVar6;
        if (local_88->sel_vector != (sel_t *)0x0) {
          uVar5 = (ulong)local_88->sel_vector[uVar6];
        }
        uVar8 = uVar6;
        if (bsel->sel_vector != (sel_t *)0x0) {
          uVar8 = (ulong)bsel->sel_vector[uVar6];
        }
        uVar4 = uVar6;
        if (csel->sel_vector != (sel_t *)0x0) {
          uVar4 = (ulong)csel->sel_vector[uVar6];
        }
        puVar1 = (avalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if ((((puVar1 == (unsigned_long *)0x0) || ((puVar1[uVar5 >> 6] >> (uVar5 & 0x3f) & 1) != 0))
            && ((puVar1 = (local_38->super_TemplatedValidityMask<unsigned_long>).validity_mask,
                puVar1 == (unsigned_long *)0x0 || ((puVar1[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) != 0))
               )) && ((puVar1 = (local_40->super_TemplatedValidityMask<unsigned_long>).validity_mask
                      , puVar1 == (unsigned_long *)0x0 ||
                      ((puVar1[uVar4 >> 6] >> (uVar4 & 0x3f) & 1) != 0)))) {
          local_94 = local_70[uVar5];
          local_8c = local_78[uVar8];
          local_90 = local_80[uVar4];
          bVar2 = GreaterThanEquals::Operation<float>(&local_94,&local_8c);
          if (bVar2) {
            bVar2 = GreaterThan::Operation<float>(&local_90,&local_94);
            uVar5 = (ulong)bVar2;
            sel = local_68;
            count = local_50;
            bsel = local_58;
            csel = local_60;
            true_sel = local_48;
          }
          else {
            uVar5 = 0;
            sel = local_68;
            count = local_50;
            bsel = local_58;
            csel = local_60;
            true_sel = local_48;
          }
        }
        else {
          uVar5 = 0;
        }
        true_sel->sel_vector[iVar3] = (sel_t)uVar7;
        iVar3 = iVar3 + uVar5;
        uVar6 = uVar6 + 1;
      } while (count != uVar6);
    }
  }
  else {
    iVar3 = SelectLoop<float,float,float,duckdb::LowerInclusiveBetweenOperator,false,true,true>
                      (local_70,local_78,local_80,sel,count,local_88,bsel,csel,avalidity,bvalidity,
                       cvalidity,true_sel,false_sel);
  }
  return iVar3;
}

Assistant:

static inline idx_t SelectLoopSelSwitch(UnifiedVectorFormat &adata, UnifiedVectorFormat &bdata,
	                                        UnifiedVectorFormat &cdata, const SelectionVector *sel, idx_t count,
	                                        SelectionVector *true_sel, SelectionVector *false_sel) {
		if (true_sel && false_sel) {
			return SelectLoop<A_TYPE, B_TYPE, C_TYPE, OP, NO_NULL, true, true>(
			    UnifiedVectorFormat::GetData<A_TYPE>(adata), UnifiedVectorFormat::GetData<B_TYPE>(bdata),
			    UnifiedVectorFormat::GetData<C_TYPE>(cdata), sel, count, *adata.sel, *bdata.sel, *cdata.sel,
			    adata.validity, bdata.validity, cdata.validity, true_sel, false_sel);
		} else if (true_sel) {
			return SelectLoop<A_TYPE, B_TYPE, C_TYPE, OP, NO_NULL, true, false>(
			    UnifiedVectorFormat::GetData<A_TYPE>(adata), UnifiedVectorFormat::GetData<B_TYPE>(bdata),
			    UnifiedVectorFormat::GetData<C_TYPE>(cdata), sel, count, *adata.sel, *bdata.sel, *cdata.sel,
			    adata.validity, bdata.validity, cdata.validity, true_sel, false_sel);
		} else {
			D_ASSERT(false_sel);
			return SelectLoop<A_TYPE, B_TYPE, C_TYPE, OP, NO_NULL, false, true>(
			    UnifiedVectorFormat::GetData<A_TYPE>(adata), UnifiedVectorFormat::GetData<B_TYPE>(bdata),
			    UnifiedVectorFormat::GetData<C_TYPE>(cdata), sel, count, *adata.sel, *bdata.sel, *cdata.sel,
			    adata.validity, bdata.validity, cdata.validity, true_sel, false_sel);
		}
	}